

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_hatch.cpp
# Opt level: O0

void __thiscall ON_HatchLine::Dump(ON_HatchLine *this,ON_TextLog *dump)

{
  uint uVar1;
  double dVar2;
  double dVar3;
  int local_20;
  int i;
  int count;
  ON_TextLog *dump_local;
  ON_HatchLine *this_local;
  
  dVar2 = AngleRadians(this);
  dVar3 = AngleDegrees(this);
  ON_TextLog::Print(dump,"ON_HatchLine: angle = %lf radians ( %lf degrees) ",dVar2,SUB84(dVar3,0));
  ON_TextLog::Print(dump," base = ");
  ON_TextLog::Print(dump,&this->m_base);
  ON_TextLog::Print(dump," offset = ");
  ON_TextLog::Print(dump,&this->m_offset);
  uVar1 = ON_SimpleArray<double>::Count(&this->m_dashes);
  ON_TextLog::Print(dump,"\nDash count = %d: ",(ulong)uVar1);
  for (local_20 = 0; local_20 < (int)uVar1; local_20 = local_20 + 1) {
    Dash(this,local_20);
    ON_TextLog::Print(dump,"%lf");
    if (local_20 < (int)(uVar1 - 1)) {
      ON_TextLog::Print(dump,", ");
    }
  }
  ON_TextLog::Print(dump,"\n");
  return;
}

Assistant:

void ON_HatchLine::Dump( ON_TextLog& dump) const
{
  dump.Print( "ON_HatchLine: angle = %lf radians ( %lf degrees) ", 
    AngleRadians(), AngleDegrees());
  dump.Print( " base = ");
  dump.Print( m_base);
  dump.Print( " offset = ");
  dump.Print( m_offset);
  int count = m_dashes.Count();
  dump.Print( "\nDash count = %d: ", count);
  for( int i = 0; i < count; i++)
  {
    dump.Print( "%lf", Dash( i));
    if( i < count-1)
      dump.Print( ", ");
  }
  dump.Print( "\n");
}